

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O2

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[13],unsigned_int,char[42],unsigned_int,char[2]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [13],uint *RestArgs,char (*RestArgs_1) [42],uint *RestArgs_2,
               char (*RestArgs_3) [2])

{
  std::operator<<((ostream *)(ss + 0x10),*FirstArg);
  FormatStrSS<std::__cxx11::stringstream,unsigned_int,char[42],unsigned_int,char[2]>
            (ss,RestArgs,RestArgs_1,RestArgs_2,RestArgs_3);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}